

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

void int_rel_reif_real(IntVar *x,IntRelType t,int c,BoolView *r)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  IntVar *y;
  BoolView *z;
  int iVar4;
  BoolView *y_00;
  BoolRelType t_00;
  BoolView *x_00;
  bool bVar5;
  int in_stack_fffffffffffffebc;
  bool local_13c [4];
  BoolView local_138;
  BoolView local_128;
  BoolView local_118;
  BoolView local_108;
  BoolView local_f8;
  BoolView local_e8;
  BoolView local_d8;
  BoolView local_c8;
  BoolView local_b8;
  BoolView local_a8;
  BoolView local_98;
  BoolView local_88;
  BoolView local_78;
  BoolView local_68;
  BoolView local_58;
  BoolView local_48;
  BoolView local_38;
  
  z = (BoolView *)&stack0xfffffffffffffeb8;
  bVar1 = BoolView::isTrue(r);
  if ((t == IRT_NE && bVar1) &&
     (iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[3])(x), iVar2 == 2)) {
    bVar1 = IntVar::indomain(x,(long)c);
    if (!bVar1) {
      return;
    }
    iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[0x11])(x,(long)c,0,1);
    if ((char)iVar2 != '\0') {
      return;
    }
    puts("=====UNSATISFIABLE=====");
    printf("%% Top level failure!\n");
    exit(0);
  }
  iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[3])(x);
  if (iVar2 == 1) {
    y = getConstant(in_stack_fffffffffffffebc);
    int_rel_reif(x,t,y,r,0);
    return;
  }
  iVar2 = (*(x->super_Var).super_Branching._vptr_Branching[0xd])(x,(long)c,2);
  iVar3 = (*(x->super_Var).super_Branching._vptr_Branching[0xd])(x,(long)c,3);
  if (IRT_GT < t) {
    fprintf(_stderr,"%s:%d: ","binary.cpp",0x1dc);
    fwrite("Assertion failed.\n",0x12,1,_stderr);
    abort();
  }
  iVar4 = iVar2 >> 1;
  bVar5 = (bool)((byte)iVar2 & 1);
  iVar2 = iVar3 >> 1;
  bVar1 = (bool)((byte)iVar3 & 1);
  switch(t) {
  case IRT_EQ:
    x_00 = &local_38;
    local_38.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    y_00 = &local_48;
    local_48.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    z = &local_58;
    local_58.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_58.v = r->v;
    local_58.s = r->s;
    local_48.v = iVar2;
    local_48.s = bVar1;
    local_38.v = iVar4;
    local_38.s = bVar5;
    break;
  case IRT_NE:
    x_00 = &local_68;
    local_68.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    y_00 = &local_78;
    local_78.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_88.v = r->v;
    z = &local_88;
    local_88.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_88.s = (bool)(r->s ^ 1);
    local_78.v = iVar2;
    local_78.s = bVar1;
    local_68.v = iVar4;
    local_68.s = bVar5;
    break;
  case IRT_LE:
    x_00 = &local_98;
    local_98.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    y_00 = &local_a8;
    local_a8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_a8.v = r->v;
    local_a8.s = r->s;
    z = &local_b8;
    local_98.v = iVar2;
    local_98.s = bVar1;
    goto LAB_0018f70f;
  case IRT_LT:
    x_00 = &local_c8;
    local_c8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_d8.v = r->v;
    y_00 = &local_d8;
    local_d8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_d8.s = (bool)(r->s ^ 1);
    z = &local_e8;
    local_c8.v = iVar4;
    local_c8.s = bVar5;
    goto LAB_0018f682;
  case IRT_GE:
    x_00 = &local_f8;
    local_f8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    y_00 = &local_108;
    local_108.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_108.v = r->v;
    local_108.s = r->s;
    z = &local_118;
    local_f8.v = iVar4;
    local_f8.s = bVar5;
LAB_0018f682:
    (z->super_Var).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_001efbb8;
    goto LAB_0018f712;
  case IRT_GT:
    x_00 = &local_128;
    local_128.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_138.v = r->v;
    y_00 = &local_138;
    local_138.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_138.s = (bool)(r->s ^ 1);
    local_128.v = iVar2;
    local_128.s = bVar1;
LAB_0018f70f:
    (z->super_Var).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_001efbb8;
LAB_0018f712:
    z->v = bv_true.v;
    z->s = bv_true.s;
    t_00 = BRT_EQ;
    goto LAB_0018f729;
  }
  t_00 = BRT_AND;
LAB_0018f729:
  bool_rel(x_00,t_00,y_00,z);
  return;
}

Assistant:

void int_rel_reif_real(IntVar* x, IntRelType t, int c, BoolView r) {
	if (r.isTrue() && t == IRT_NE && x->getType() == INT_VAR_EL) {
		TL_SET(x, remVal, c);
		return;
	}
	if (x->getType() == INT_VAR) {
		assert(!so.lazy);
		IntVar* v = getConstant(c);
		int_rel_reif(x, t, v, r);
		return;
	}
	const BoolView b1(x->getLit(c, LR_GE));
	const BoolView b2(x->getLit(c, LR_LE));
	switch (t) {
		case IRT_EQ:
			bool_rel(b1, BRT_AND, b2, r);
			break;
		case IRT_NE:
			bool_rel(b1, BRT_AND, b2, ~r);
			break;
		case IRT_LE:
			bool_rel(b2, BRT_EQ, r);
			break;
		case IRT_LT:
			bool_rel(b1, BRT_EQ, ~r);
			break;
		case IRT_GE:
			bool_rel(b1, BRT_EQ, r);
			break;
		case IRT_GT:
			bool_rel(b2, BRT_EQ, ~r);
			break;
		default:
			NEVER;
	}
}